

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_crc32.c
# Opt level: O3

ngx_int_t ngx_crc32_table_init(void)

{
  undefined8 uVar1;
  void *pvVar2;
  
  if (((ulong)ngx_crc32_table_short & ngx_cacheline_size - 1) != 0) {
    pvVar2 = ngx_alloc(ngx_cacheline_size + 0x40,ngx_cycle->log);
    uVar1 = ngx_crc32_table16._56_8_;
    if (pvVar2 == (void *)0x0) {
      return -1;
    }
    ngx_crc32_table_short =
         (uint32_t *)(-ngx_cacheline_size & (long)pvVar2 + (ngx_cacheline_size - 1));
    *(undefined8 *)(ngx_crc32_table_short + 0xc) = ngx_crc32_table16._48_8_;
    *(undefined8 *)(ngx_crc32_table_short + 0xe) = uVar1;
    uVar1 = ngx_crc32_table16._40_8_;
    *(undefined8 *)(ngx_crc32_table_short + 8) = ngx_crc32_table16._32_8_;
    *(undefined8 *)(ngx_crc32_table_short + 10) = uVar1;
    uVar1 = ngx_crc32_table16._24_8_;
    *(undefined8 *)(ngx_crc32_table_short + 4) = ngx_crc32_table16._16_8_;
    *(undefined8 *)(ngx_crc32_table_short + 6) = uVar1;
    uVar1 = ngx_crc32_table16._8_8_;
    *(undefined8 *)ngx_crc32_table_short = ngx_crc32_table16._0_8_;
    *(undefined8 *)(ngx_crc32_table_short + 2) = uVar1;
  }
  return 0;
}

Assistant:

ngx_int_t
ngx_crc32_table_init(void)
{
    void  *p;

    if (((uintptr_t) ngx_crc32_table_short
          & ~((uintptr_t) ngx_cacheline_size - 1))
        == (uintptr_t) ngx_crc32_table_short)
    {
        return NGX_OK;
    }

    p = ngx_alloc(16 * sizeof(uint32_t) + ngx_cacheline_size, ngx_cycle->log);
    if (p == NULL) {
        return NGX_ERROR;
    }

    p = ngx_align_ptr(p, ngx_cacheline_size);

    ngx_memcpy(p, ngx_crc32_table16, 16 * sizeof(uint32_t));

    ngx_crc32_table_short = p;

    return NGX_OK;
}